

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool __thiscall
crnd::crn_unpacker::unpack_etc1
          (crn_unpacker *this,uint8 **pDst,uint32 output_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  block_buffer_element *pbVar1;
  uint uVar2;
  bool bVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  symbol_codec *this_00;
  uint uVar12;
  byte bVar13;
  crn_unpacker *pcVar14;
  undefined4 in_register_00000084;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  uint8 e1 [4];
  uint8 e0 [4];
  uint8 block_endpoint [4];
  uint local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  uint local_ac;
  uint32 local_a8;
  undefined4 local_a4;
  crn_unpacker *local_a0;
  symbol_codec *local_98;
  undefined8 local_90;
  ulong local_88;
  static_huffman_data_model *local_80;
  vector<crnd::crn_unpacker::block_buffer_element> *local_78;
  uint8 *local_70;
  uint8 **local_68;
  ulong local_60;
  long local_58;
  static_huffman_data_model *local_50;
  ulong local_48;
  ulong local_40;
  static_huffman_data_model *local_38;
  
  local_90 = CONCAT44(in_register_00000084,output_height);
  local_a8 = (this->m_color_endpoints).m_size;
  uVar7 = (this->m_block_buffer).m_size;
  uVar8 = output_width + 1 & 0xfffffffe;
  local_88 = (ulong)uVar8;
  uVar12 = uVar8 * 2;
  local_78 = &this->m_block_buffer;
  local_a0 = this;
  local_68 = pDst;
  if (uVar7 < uVar12) {
    if ((uVar12 <= (this->m_block_buffer).m_capacity) ||
       (bVar3 = elemental_vector::increase_capacity
                          ((elemental_vector *)local_78,uVar12,uVar7 + 1 == uVar12,8,
                           (object_mover)0x0), bVar3)) {
      (local_a0->m_block_buffer).m_size = uVar12;
    }
    else {
      (local_a0->m_block_buffer).m_alloc_failed = true;
    }
  }
  if ((local_a0->m_pHeader->m_faces).m_buf[0] != '\0') {
    local_ac = (int)local_90 + 1U & 0xfffffffe;
    this_00 = &local_a0->m_codec;
    local_50 = &local_a0->m_reference_encoding_dm;
    local_80 = local_a0->m_endpoint_delta_dm;
    local_38 = local_a0->m_selector_delta_dm;
    local_58 = (long)(int)((output_pitch_in_bytes >> 2) + uVar8 * -2);
    local_40 = (ulong)output_width;
    local_48 = local_88 & 0xffffffff;
    local_60 = 0;
    uVar7 = 0;
    uVar12 = 0;
    pcVar14 = local_a0;
    local_98 = this_00;
    do {
      if (local_ac != 0) {
        local_70 = local_68[local_60];
        local_b8 = 0;
        do {
          if ((int)local_88 != 0) {
            bVar3 = local_b8 < (uint)local_90;
            uVar15 = 0;
            do {
              bVar16 = uVar15 < local_40;
              uVar9 = (ulong)(uint)((int)uVar15 * 2);
              pbVar1 = local_78->m_p;
              if ((local_b8 & 1) == 0) {
                uVar4 = symbol_codec::decode(this_00,local_50);
                uVar8 = uVar4 >> 2 & 0xc;
                pbVar1[uVar9].endpoint_reference =
                     (ushort)(uVar4 >> 4) & 0xc | (ushort)(uVar4 >> 2) & 3;
                this_00 = local_98;
                pcVar14 = local_a0;
                switch(uVar4 & 3) {
                case 0:
                  goto switchD_00114de7_caseD_0;
                case 1:
switchD_00114de7_caseD_1:
                  pbVar1[uVar9].color_endpoint_index = (uint16)uVar7;
                  break;
                case 2:
switchD_00114de7_caseD_2:
                  uVar7 = (uint)pbVar1[uVar9].color_endpoint_index;
                  break;
                case 3:
switchD_00114de7_caseD_3:
                  pbVar1[uVar9].color_endpoint_index = (uint16)uVar12;
                  uVar7 = uVar12;
                }
              }
              else {
                uVar8 = (uint)(byte)pbVar1[uVar9].endpoint_reference;
                switch(uVar8 & 3) {
                case 1:
                  goto switchD_00114de7_caseD_1;
                case 2:
                  goto switchD_00114de7_caseD_2;
                case 3:
                  goto switchD_00114de7_caseD_3;
                }
switchD_00114de7_caseD_0:
                uVar5 = symbol_codec::decode(this_00,local_80);
                uVar4 = local_a8;
                if (uVar5 + uVar7 < local_a8) {
                  uVar4 = 0;
                }
                uVar7 = (uVar5 + uVar7) - uVar4;
                pbVar1[uVar9].color_endpoint_index = (uint16)uVar7;
                this_00 = local_98;
                pcVar14 = local_a0;
              }
              local_b0 = (pcVar14->m_color_endpoints).m_p[uVar7];
              uVar4 = symbol_codec::decode(this_00,local_38);
              if ((uVar8 & 0xfc) != 0) {
                uVar6 = symbol_codec::decode(this_00,local_80);
                uVar5 = local_a8;
                if (uVar6 + uVar7 < local_a8) {
                  uVar5 = 0;
                }
                uVar7 = (uVar6 + uVar7) - uVar5;
              }
              bVar3 = (bool)(bVar3 & bVar16);
              pbVar1 = (local_a0->m_block_buffer).m_p;
              uVar12 = (uint)pbVar1[uVar9 | 1].color_endpoint_index;
              pbVar1[uVar9 + 1].color_endpoint_index = (uint16)uVar7;
              local_b4 = (local_a0->m_color_endpoints).m_p[uVar7];
              uVar2 = local_b4;
              if (bVar3) {
                uVar9 = 0;
                do {
                  bVar16 = (uint)*(byte *)((long)&local_b4 + uVar9) <=
                           *(byte *)((long)&local_b0 + uVar9) + 3;
                  bVar17 = (uint)*(byte *)((long)&local_b0 + uVar9) <=
                           *(byte *)((long)&local_b4 + uVar9) + 4;
                  if (!bVar17 || !bVar16) break;
                  bVar18 = uVar9 < 2;
                  uVar9 = uVar9 + 1;
                } while (bVar18);
                lVar10 = 0;
                do {
                  bVar11 = *(char *)((long)&local_b0 + lVar10) * '\b';
                  if (bVar17 && bVar16) {
                    bVar13 = *(char *)((long)&local_b4 + lVar10) -
                             *(char *)((long)&local_b0 + lVar10) & 7;
                  }
                  else {
                    bVar11 = bVar11 & 0xf0;
                    bVar13 = *(byte *)((long)&local_b4 + lVar10) >> 1;
                  }
                  *(byte *)((long)&local_a4 + lVar10) = bVar13 | bVar11;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                uVar8 = uVar8 >> 3 ^ 1;
                local_b4._3_1_ = (char)(local_b4 >> 0x18);
                local_a4 = CONCAT13((bVar17 && bVar16) * '\x02' | (byte)uVar8 |
                                    local_b4._3_1_ << 2 | local_b0._3_1_ << 5,(undefined3)local_a4);
                *(undefined4 *)local_70 = local_a4;
                *(uint *)(local_70 + 4) = (local_a0->m_color_selectors).m_p[uVar4 * 2 | uVar8];
              }
              uVar15 = uVar15 + 1;
              local_70 = local_70 + 8;
              this_00 = local_98;
              pcVar14 = local_a0;
              local_b4 = uVar2;
            } while (uVar15 != local_48);
          }
          local_b8 = local_b8 + 1;
          local_70 = local_70 + local_58 * 4;
        } while (local_b8 != local_ac);
      }
      local_60 = local_60 + 1;
    } while (local_60 < (pcVar14->m_pHeader->m_faces).m_buf[0]);
  }
  return true;
}

Assistant:

bool unpack_etc1(uint8** pDst, uint32 output_pitch_in_bytes, uint32 output_width, uint32 output_height)
        {
            const uint32 num_color_endpoints = m_color_endpoints.size();
            const uint32 width = (output_width + 1) & ~1;
            const uint32 height = (output_height + 1) & ~1;
            const int32 delta_pitch_in_dwords = (output_pitch_in_bytes >> 2) - (width << 1);

            if (m_block_buffer.size() < width << 1)
                m_block_buffer.resize(width << 1);

            uint32 color_endpoint_index = 0, diagonal_color_endpoint_index = 0;
            uint8 reference_group = 0;

            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
            {
                uint32* pData = (uint32*)pDst[f];
                for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords)
                {
                    bool visible = y < output_height;
                    for (uint32 x = 0; x < width; x++, pData += 2)
                    {
                        visible = visible && x < output_width;
                        block_buffer_element& buffer = m_block_buffer[x << 1];
                        uint8 endpoint_reference, block_endpoint[4], e0[4], e1[4];
                        if (y & 1)
                        {
                            endpoint_reference = buffer.endpoint_reference;
                        }
                        else
                        {
                            reference_group = m_codec.decode(m_reference_encoding_dm);
                            endpoint_reference = (reference_group & 3) | (reference_group >> 2 & 12);
                            buffer.endpoint_reference = (reference_group >> 2 & 3) | (reference_group >> 4 & 12);
                        }
                        if (!(endpoint_reference & 3))
                        {
                            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
                            if (color_endpoint_index >= num_color_endpoints)
                                color_endpoint_index -= num_color_endpoints;
                            buffer.color_endpoint_index = color_endpoint_index;
                        }
                        else if ((endpoint_reference & 3) == 1)
                        {
                            buffer.color_endpoint_index = color_endpoint_index;
                        }
                        else if ((endpoint_reference & 3) == 3)
                        {
                            buffer.color_endpoint_index = color_endpoint_index = diagonal_color_endpoint_index;
                        }
                        else
                        {
                            color_endpoint_index = buffer.color_endpoint_index;
                        }
                        endpoint_reference >>= 2;
                        *(uint32*)&e0 = m_color_endpoints[color_endpoint_index];
                        uint32 selector_index = m_codec.decode(m_selector_delta_dm[0]);
                        if (endpoint_reference)
                        {
                            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
                            if (color_endpoint_index >= num_color_endpoints)
                                color_endpoint_index -= num_color_endpoints;
                        }
                        diagonal_color_endpoint_index = m_block_buffer[x << 1 | 1].color_endpoint_index;
                        m_block_buffer[x << 1 | 1].color_endpoint_index = color_endpoint_index;
                        *(uint32*)&e1 = m_color_endpoints[color_endpoint_index];
                        if (visible)
                        {
                            uint32 flip = endpoint_reference >> 1 ^ 1, diff = 1;
                            for (uint c = 0; diff && c < 3; c++)
                                diff = e0[c] + 3 >= e1[c] && e1[c] + 4 >= e0[c] ? diff : 0;
                            for (uint c = 0; c < 3; c++)
                                block_endpoint[c] = diff ? e0[c] << 3 | ((e1[c] - e0[c]) & 7) : (e0[c] << 3 & 0xF0) | e1[c] >> 1;
                            block_endpoint[3] = e0[3] << 5 | e1[3] << 2 | diff << 1 | flip;
                            pData[0] = *(uint32*)&block_endpoint;
                            pData[1] = m_color_selectors[selector_index << 1 | flip];
                        }
                    }
                }
            }
            return true;
        }